

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Functions.cpp
# Opt level: O1

string_view RenX::getFullTeamName(TeamType team)

{
  undefined **ppuVar1;
  size_t *psVar2;
  string_view sVar3;
  
  if (team == GDI) {
    ppuVar1 = &_ZL11GDILongName_1;
    psVar2 = &_ZL11GDILongName_0;
  }
  else if (team == Nod) {
    ppuVar1 = &_ZL11NodLongName_1;
    psVar2 = &_ZL11NodLongName_0;
  }
  else {
    ppuVar1 = &_ZL13OtherLongName_1;
    psVar2 = &_ZL13OtherLongName_0;
  }
  sVar3._M_str = *ppuVar1;
  sVar3._M_len = *psVar2;
  return sVar3;
}

Assistant:

std::string_view RenX::getFullTeamName(TeamType team)
{
	switch (team)
	{
	case RenX::TeamType::GDI:
		return GDILongName;
	case RenX::TeamType::Nod:
		return NodLongName;
	default:
		return OtherLongName;
	}
}